

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetObjectDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x10])
            (__return_storage_ptr__,this->GlobalGenerator,&this->ObjectDirectory,config);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetObjectDirectory(
  std::string const& config) const
{
  std::string obj_dir =
    this->GlobalGenerator->ExpandCFGIntDir(this->ObjectDirectory, config);
#if defined(__APPLE__)
  // find and replace $(PROJECT_NAME) xcode placeholder
  const std::string projectName = this->LocalGenerator->GetProjectName();
  cmSystemTools::ReplaceString(obj_dir, "$(PROJECT_NAME)", projectName);
#endif
  return obj_dir;
}